

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

int64_t sensors_analytics::utils::GenerateTrackId(void)

{
  int iVar1;
  int64_t __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [32];
  string local_d8 [8];
  string timestamp_sub;
  __cxx11 local_b8 [8];
  string timestamp;
  string local_98 [8];
  string second_sub;
  __cxx11 local_78 [8];
  string second;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [8];
  string first_sub;
  __cxx11 local_28 [8];
  string first;
  
  iVar1 = rand();
  std::__cxx11::to_string(local_28,iVar1 + 100 + (iVar1 / 99) * -99);
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_48,(ulong)local_28);
  iVar1 = rand();
  std::__cxx11::to_string(local_78,iVar1 + 1000 + (iVar1 / 999) * -999);
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_98,(ulong)local_78);
  __val = CurrentTimestamp();
  std::__cxx11::to_string(local_b8,__val);
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_d8,(ulong)local_b8);
  std::operator+(local_118,local_48);
  std::operator+(local_f8,local_118);
  iVar1 = std::__cxx11::stoi(local_f8,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string((string *)local_28);
  return (long)iVar1;
}

Assistant:

int64_t GenerateTrackId() {
    string first = std::to_string(rand() % 99 + 100);
    string first_sub = first.substr(first.length() - 2, 2);

    string second = std::to_string(rand() % 999 + 1000);
    string second_sub = second.substr(second.length() - 3, 3);

    string timestamp = std::to_string(CurrentTimestamp());
    string timestamp_sub = timestamp.substr(timestamp.length() - 4, 4);

    return std::stoi(first_sub + second_sub + timestamp_sub);
}